

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

void Gia_ManFindUnatePairs
               (word **pSets,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vBinateVars,
               Vec_Int_t **vUnatePairs,int fVerbose)

{
  bool bVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int fVerbose_00;
  bool bVar3;
  ulong uVar4;
  
  if (fVerbose != 0) {
    printf("  ");
  }
  uVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    iVar2 = vUnatePairs[uVar4]->nSize;
    Gia_ManFindUnatePairsInt
              (pSets[uVar4],pSets[uVar4 ^ 1],vBinateVars,vDivs,nWords,vUnatePairs[uVar4]);
    fVerbose_00 = extraout_EDX;
    if (fVerbose != 0) {
      printf("UP%d =%5d ",uVar4,(ulong)(uint)(vUnatePairs[uVar4]->nSize - iVar2));
      fVerbose_00 = extraout_EDX_00;
    }
    uVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  iVar2 = Gia_ManFindFirstCommonLit(*vUnatePairs,vUnatePairs[1],fVerbose_00);
  if (iVar2 == -1) {
    return;
  }
  __assert_fail("RetValue == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub.c"
                ,0x369,
                "void Gia_ManFindUnatePairs(word **, Vec_Ptr_t *, int, Vec_Int_t *, Vec_Int_t **, int)"
               );
}

Assistant:

void Gia_ManFindUnatePairs( word * pSets[2], Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vBinateVars, Vec_Int_t * vUnatePairs[2], int fVerbose )
{
    int n, RetValue;
    if ( fVerbose ) printf( "  " );
    for ( n = 0; n < 2; n++ )
    {
        int nBefore = Vec_IntSize(vUnatePairs[n]);
        Gia_ManFindUnatePairsInt( pSets[n], pSets[!n], vBinateVars, vDivs, nWords, vUnatePairs[n] );
        if ( fVerbose ) printf( "UP%d =%5d ", n, Vec_IntSize(vUnatePairs[n])-nBefore );
    }
    RetValue = Gia_ManFindFirstCommonLit( vUnatePairs[0], vUnatePairs[1], fVerbose );
    assert( RetValue == -1 );
}